

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O2

void __thiscall
sjtu::map<long,_sjtu::LRUCache<sjtu::TrainManager::stationNameType>::CacheNode_*,_std::less<long>_>
::insert_fixup(map<long,_sjtu::LRUCache<sjtu::TrainManager::stationNameType>::CacheNode_*,_std::less<long>_>
               *this,Node *x)

{
  color_type cVar1;
  Node *pNVar2;
  Node *pNVar3;
  Node *pNVar4;
  
  do {
    while( true ) {
      pNVar2 = x->parent;
      if (pNVar2->color != RED) {
        this->nil->left->color = BLACK;
        return;
      }
      pNVar3 = pNVar2->parent->left;
      pNVar4 = pNVar2;
      if (pNVar3 != pNVar2) break;
      pNVar3 = pNVar2->parent->right;
      if (pNVar3->color == RED) goto LAB_0011233b;
      if (pNVar2->right == x) {
        left_rotate(this,x);
        pNVar4 = pNVar2->parent;
        x = pNVar2;
      }
      right_rotate(this,pNVar4);
      pNVar2 = pNVar4->right;
LAB_00112328:
      cVar1 = pNVar4->color;
      pNVar4->color = pNVar2->color;
      pNVar2->color = cVar1;
    }
    if (pNVar3->color != RED) {
      if (pNVar2->left == x) {
        right_rotate(this,x);
        pNVar4 = pNVar2->parent;
        x = pNVar2;
      }
      left_rotate(this,pNVar4);
      pNVar2 = pNVar4->left;
      goto LAB_00112328;
    }
LAB_0011233b:
    pNVar3->color = BLACK;
    pNVar2->color = BLACK;
    x = pNVar3->parent;
    x->color = RED;
  } while( true );
}

Assistant:

void insert_fixup(Node *x)
	{
		for (Node *y;x -> parent -> color == RED;)
			if (x -> parent -> parent -> left == x -> parent)
			{
				y = x -> parent -> parent -> right;
				if (y -> color == RED)
				{
					x -> parent -> color = y -> color = BLACK , y -> parent -> color = RED;
					x = y -> parent;
				}
				else
				{
					y = x -> parent;
					if (y -> right == x) left_rotate(x) , x = y , y = x -> parent;
					right_rotate(y) , std::swap(y -> color , y -> right -> color);
				}
			}
			else
			{
				y = x -> parent -> parent -> left;
				if (y -> color == RED)
				{
					x -> parent -> color = y -> color = BLACK , y -> parent -> color = RED;
					x = y -> parent;
				}
				else
				{
					y = x -> parent;
					if (y -> left == x) right_rotate(x) , x = y , y = x -> parent;
					left_rotate(y) , std::swap(y -> color , y -> left -> color);
				}
			}
		nil -> left -> color = BLACK;
	}